

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

void resolve_iffeature_getsizes(lys_iffeature *iffeat,uint *expr_size,uint *feat_size)

{
  byte bVar1;
  int iVar2;
  uint pos;
  uint uVar3;
  bool bVar4;
  
  if (iffeat == (lys_iffeature *)0x0) {
    __assert_fail("iffeat",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x4fe,
                  "void resolve_iffeature_getsizes(struct lys_iffeature *, unsigned int *, unsigned int *)"
                 );
  }
  if (iffeat->expr == (uint8_t *)0x0) {
    uVar3 = 0;
    pos = 0;
  }
  else {
    uVar3 = 0;
    iVar2 = 0;
    pos = 0;
    do {
      bVar1 = iff_getop(iffeat->expr,pos);
      if (bVar1 - 1 < 2) {
        bVar4 = iVar2 == 0;
        iVar2 = iVar2 + 1;
        if (bVar4) {
          iVar2 = 2;
        }
      }
      else if (bVar1 == 3) {
        uVar3 = uVar3 + 1;
        bVar4 = iVar2 == 0;
        iVar2 = iVar2 + -1;
        if (bVar4) {
          iVar2 = 0;
        }
      }
      else if (bVar1 == 0) {
        iVar2 = iVar2 + (uint)(iVar2 == 0);
      }
      pos = pos + 1;
    } while (iVar2 != 0);
  }
  if (expr_size != (uint *)0x0) {
    *expr_size = pos;
  }
  if (feat_size != (uint *)0x0) {
    *feat_size = uVar3;
  }
  return;
}

Assistant:

void
resolve_iffeature_getsizes(struct lys_iffeature *iffeat, unsigned int *expr_size, unsigned int *feat_size)
{
    unsigned int e = 0, f = 0, r = 0;
    uint8_t op;

    assert(iffeat);

    if (!iffeat->expr) {
        goto result;
    }

    do {
        op = iff_getop(iffeat->expr, e++);
        switch (op) {
        case LYS_IFF_NOT:
            if (!r) {
                r += 1;
            }
            break;
        case LYS_IFF_AND:
        case LYS_IFF_OR:
            if (!r) {
                r += 2;
            } else {
                r += 1;
            }
            break;
        case LYS_IFF_F:
            f++;
            if (r) {
                r--;
            }
            break;
        }
    } while(r);

result:
    if (expr_size) {
        *expr_size = e;
    }
    if (feat_size) {
        *feat_size = f;
    }
}